

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O2

bool __thiscall
bssl::tls1_configure_aead
          (bssl *this,SSL *ssl,evp_aead_direction_t direction,Array<unsigned_char> *key_block_cache,
          SSL_SESSION *session,Span<const_unsigned_char> iv_override)

{
  size_t new_size;
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  Array<unsigned_char> *this_00;
  SSL_SESSION *session_00;
  size_t in_R9;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *this_01;
  Span<const_unsigned_char> enc_key;
  Span<unsigned_char> out;
  Span<const_unsigned_char> SVar5;
  size_t mac_secret_len;
  UniquePtr<SSLAEADContext> aead_ctx;
  size_t iv_len;
  size_t local_a0;
  uchar *local_98;
  size_t local_90;
  size_t local_88;
  SSL_SESSION *local_80;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_78;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_70;
  Span<const_unsigned_char> key_block;
  size_t key_len;
  Span<const_unsigned_char> local_50;
  uchar *local_40;
  size_t sStack_38;
  uchar *puVar4;
  
  this_00 = (Array<unsigned_char> *)CONCAT44(in_register_00000014,direction);
  session_00 = (SSL_SESSION *)key_block_cache[0xd].size_;
  bVar1 = get_key_block_lengths
                    ((SSL *)this,&mac_secret_len,&key_len,&iv_len,(SSL_CIPHER *)session_00);
  if (bVar1) {
    new_size = (mac_secret_len + key_len + iv_len) * 2;
    sVar3 = this_00->size_;
    local_88 = in_R9;
    local_80 = session;
    if (sVar3 == 0) {
      bVar1 = Array<unsigned_char>::InitUninitialized(this_00,new_size);
      if (!bVar1) {
        return false;
      }
      out.size_ = (size_t)key_block_cache;
      out.data_ = (uchar *)this_00->size_;
      bVar1 = generate_key_block(this,(SSL *)this_00->data_,out,session_00);
      if (!bVar1) {
        return false;
      }
      sVar3 = this_00->size_;
    }
    if (sVar3 != new_size) {
      __assert_fail("key_block_cache->size() == key_block_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                    ,100,
                    "bool bssl::tls1_configure_aead(SSL *, evp_aead_direction_t, Array<uint8_t> *, const SSL_SESSION *, Span<const uint8_t>)"
                   );
    }
    key_block.data_ = this_00->data_;
    key_block.size_ = new_size;
    if ((~*(uint *)(this + 0xa4) & 1) == (uint)ssl) {
      SVar5 = Span<const_unsigned_char>::subspan(&key_block,0,mac_secret_len);
      local_90 = SVar5.size_;
      puVar4 = SVar5.data_;
      SVar5 = Span<const_unsigned_char>::subspan(&key_block,mac_secret_len * 2,key_len);
      sVar3 = (key_len + mac_secret_len) * 2;
    }
    else {
      SVar5 = Span<const_unsigned_char>::subspan(&key_block,mac_secret_len,mac_secret_len);
      local_90 = SVar5.size_;
      puVar4 = SVar5.data_;
      SVar5 = Span<const_unsigned_char>::subspan(&key_block,mac_secret_len * 2 + key_len,key_len);
      sVar3 = iv_len + (key_len + mac_secret_len) * 2;
    }
    local_a0 = SVar5.size_;
    local_98 = SVar5.data_;
    local_50 = Span<const_unsigned_char>::subspan(&key_block,sVar3,iv_len);
    if ((local_88 == 0) ||
       (local_50.size_ = local_88, local_50.data_ = (uchar *)local_80, iv_len == local_88)) {
      sStack_38 = local_90;
      SVar5.size_ = local_90;
      SVar5.data_ = puVar4;
      enc_key.size_ = (size_t)local_98;
      enc_key.data_ = (uchar *)key_block_cache[0xd].size_;
      local_40 = puVar4;
      SSLAEADContext::Create
                ((evp_aead_direction_t)&aead_ctx,(uint16_t)ssl,
                 (SSL_CIPHER *)(ulong)*(ushort *)(*(long *)(this + 0x30) + 0xd0),enc_key,SVar5,
                 local_50);
      if ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)
          aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)0x0) {
        uVar2 = 0;
      }
      else {
        if ((uint)ssl == 0) {
          this_01 = &local_70;
          local_70._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
               aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
          aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
               (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)0x0;
          uVar2 = (**(code **)(*(long *)this + 0x98))(this,3,this_01,0,0);
        }
        else {
          this_01 = &local_78;
          local_78._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
               aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
          aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
               (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)0x0;
          uVar2 = (**(code **)(*(long *)this + 0xa0))(this,3,this_01,0,0);
        }
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(this_01);
      }
      std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&aead_ctx);
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

bool tls1_configure_aead(SSL *ssl, evp_aead_direction_t direction,
                         Array<uint8_t> *key_block_cache,
                         const SSL_SESSION *session,
                         Span<const uint8_t> iv_override) {
  size_t mac_secret_len, key_len, iv_len;
  if (!get_key_block_lengths(ssl, &mac_secret_len, &key_len, &iv_len,
                             session->cipher)) {
    return false;
  }

  // Ensure that |key_block_cache| is set up.
  const size_t key_block_size = 2 * (mac_secret_len + key_len + iv_len);
  if (key_block_cache->empty()) {
    if (!key_block_cache->InitForOverwrite(key_block_size) ||
        !generate_key_block(ssl, Span(*key_block_cache), session)) {
      return false;
    }
  }
  assert(key_block_cache->size() == key_block_size);

  Span<const uint8_t> key_block = *key_block_cache;
  Span<const uint8_t> mac_secret, key, iv;
  if (direction == (ssl->server ? evp_aead_open : evp_aead_seal)) {
    // Use the client write (server read) keys.
    mac_secret = key_block.subspan(0, mac_secret_len);
    key = key_block.subspan(2 * mac_secret_len, key_len);
    iv = key_block.subspan(2 * mac_secret_len + 2 * key_len, iv_len);
  } else {
    // Use the server write (client read) keys.
    mac_secret = key_block.subspan(mac_secret_len, mac_secret_len);
    key = key_block.subspan(2 * mac_secret_len + key_len, key_len);
    iv = key_block.subspan(2 * mac_secret_len + 2 * key_len + iv_len, iv_len);
  }

  if (!iv_override.empty()) {
    if (iv_override.size() != iv_len) {
      return false;
    }
    iv = iv_override;
  }

  UniquePtr<SSLAEADContext> aead_ctx = SSLAEADContext::Create(
      direction, ssl->s3->version, session->cipher, key, mac_secret, iv);
  if (!aead_ctx) {
    return false;
  }

  if (direction == evp_aead_open) {
    return ssl->method->set_read_state(ssl, ssl_encryption_application,
                                       std::move(aead_ctx),
                                       /*traffic_secret=*/{});
  }

  return ssl->method->set_write_state(ssl, ssl_encryption_application,
                                      std::move(aead_ctx),
                                      /*traffic_secret=*/{});
}